

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_datepicker.cpp
# Opt level: O0

void QtMWidgets::DatePicker::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  qint64 *pqVar1;
  QDate QVar2;
  void *_v_1;
  DatePicker *_t_1;
  void *_v;
  DatePicker *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == ReadProperty) {
    pqVar1 = (qint64 *)*_a;
    if (_id == 0) {
      QVar2 = DateTimePicker::date((DateTimePicker *)_o);
      *pqVar1 = QVar2.jd;
    }
  }
  else if ((_c == WriteProperty) && (_id == 0)) {
    DateTimePicker::setDate((DateTimePicker *)_o,(QDate *)*_a);
  }
  return;
}

Assistant:

void QtMWidgets::DatePicker::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<DatePicker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QDate*>(_v) = _t->date(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<DatePicker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDate(*reinterpret_cast< QDate*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}